

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

void __thiscall Matrix::transpose(Matrix *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<int,std::allocator<int>> *this_03;
  vector<double,std::allocator<double>> *this_04;
  iterator iVar1;
  iterator __position;
  pointer pdVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  pointer piVar6;
  long lVar7;
  long lVar8;
  double val;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  row_values;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  row_indices;
  double local_70;
  int local_64;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  if (this->has_transpose == false) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_48,(long)(this->mat).num_row,(allocator_type *)&local_60);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_60,(long)(this->mat).num_row,(allocator_type *)&local_70);
    local_64 = 0;
    iVar4 = (this->mat).num_col;
    if (0 < iVar4) {
      piVar6 = (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = 0;
      do {
        iVar3 = (int)uVar5;
        lVar7 = (long)piVar6[iVar3];
        if (piVar6[iVar3] < piVar6[(long)iVar3 + 1]) {
          do {
            iVar4 = (this->mat).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar7];
            local_70 = (this->mat).value.super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar7];
            this_03 = (vector<int,std::allocator<int>> *)
                      (local_48.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar4);
            iVar1._M_current = *(int **)(this_03 + 8);
            if (iVar1._M_current == *(int **)(this_03 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (this_03,iVar1,&local_64);
            }
            else {
              *iVar1._M_current = (int)uVar5;
              *(int **)(this_03 + 8) = iVar1._M_current + 1;
            }
            this_04 = (vector<double,std::allocator<double>> *)
                      (local_60.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar4);
            __position._M_current = *(double **)(this_04 + 8);
            if (__position._M_current == *(double **)(this_04 + 0x10)) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (this_04,__position,&local_70);
            }
            else {
              *__position._M_current = local_70;
              *(double **)(this_04 + 8) = __position._M_current + 1;
            }
            lVar7 = lVar7 + 1;
            uVar5 = (ulong)local_64;
            piVar6 = (this->mat).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (lVar7 < piVar6[uVar5 + 1]);
          uVar5 = uVar5 + 1;
          iVar4 = (this->mat).num_col;
        }
        else {
          uVar5 = (ulong)(iVar3 + 1);
        }
        local_64 = (int)uVar5;
      } while (local_64 < iVar4);
    }
    piVar6 = (this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar6) {
      (this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar6;
    }
    piVar6 = (this->tran).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->tran).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar6) {
      (this->tran).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar6;
    }
    this_00 = &(this->tran).start;
    pdVar2 = (this->tran).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->tran).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar2) {
      (this->tran).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar2;
    }
    std::vector<int,_std::allocator<int>_>::reserve(this_00,(long)(this->mat).num_row + 1);
    this_01 = &(this->tran).index;
    std::vector<int,_std::allocator<int>_>::reserve
              (this_01,(long)(this->mat).index.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)(this->mat).index.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2);
    this_02 = &(this->tran).value;
    std::vector<double,_std::allocator<double>_>::reserve
              (this_02,(long)(this->mat).value.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->mat).value.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3);
    local_70 = (double)((ulong)local_70 & 0xffffffff00000000);
    iVar1._M_current =
         (this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,(int *)&local_70)
      ;
    }
    else {
      *iVar1._M_current = 0;
      (this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    iVar4 = (this->mat).num_row;
    if (0 < iVar4) {
      lVar7 = 2;
      lVar8 = 0;
      do {
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)this_01,
                   (this->tran).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   *(undefined8 *)
                    ((long)local_48.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar7 * 4 + -8),
                   *(undefined8 *)
                    ((long)&((local_48.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar7 * 4));
        std::vector<double,std::allocator<double>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  ((vector<double,std::allocator<double>> *)this_02,
                   (this->tran).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   *(undefined8 *)
                    ((long)local_60.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar7 * 4 + -8),
                   *(undefined8 *)
                    ((long)&((local_60.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar7 * 4));
        iVar4 = (int)((ulong)(*(long *)((long)&((local_48.
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_start + lVar7 * 4)
                             - *(long *)((long)local_48.
                                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                        lVar7 * 4 + -8)) >> 2) +
                (this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8];
        local_70 = (double)CONCAT44(local_70._4_4_,iVar4);
        iVar1._M_current =
             (this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (this_00,iVar1,(int *)&local_70);
        }
        else {
          *iVar1._M_current = iVar4;
          (this->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        lVar8 = lVar8 + 1;
        iVar4 = (this->mat).num_row;
        lVar7 = lVar7 + 6;
      } while (lVar8 < iVar4);
    }
    (this->tran).num_col = iVar4;
    (this->tran).num_row = (this->mat).num_col;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_60);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_48);
  }
  return;
}

Assistant:

void transpose() {
    if (!has_transpose) {
      std::vector<std::vector<HighsInt>> row_indices(mat.num_row);
      std::vector<std::vector<double>> row_values(mat.num_row);

      for (HighsInt col = 0; col < mat.num_col; col++) {
        for (HighsInt entry = mat.start[col]; entry < mat.start[col + 1];
             entry++) {
          HighsInt row = mat.index[entry];
          double val = mat.value[entry];
          row_indices[row].push_back(col);
          row_values[row].push_back(val);
        }
      }
      tran.start.clear();
      tran.index.clear();
      tran.value.clear();
      tran.start.reserve(mat.num_row + 1);
      tran.index.reserve(mat.index.size());
      tran.value.reserve(mat.value.size());

      tran.start.push_back(0);
      for (HighsInt row = 0; row < mat.num_row; row++) {
        tran.index.insert(tran.index.end(), row_indices[row].begin(),
                          row_indices[row].end());
        tran.value.insert(tran.value.end(), row_values[row].begin(),
                          row_values[row].end());

        tran.start.push_back(tran.start[row] + row_indices[row].size());
      }

      tran.num_col = mat.num_row;
      tran.num_row = mat.num_col;
    }
  }